

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O3

ShapeRange * __thiscall
CoreML::ShapeRange::operator/(ShapeRange *__return_storage_ptr__,ShapeRange *this,int val)

{
  runtime_error *this_00;
  stringstream ss;
  string asStack_1c8 [32];
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  if (0 < val) {
    operator/(__return_storage_ptr__,this,(ulong)(uint)val);
    return __return_storage_ptr__;
  }
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"Dividing ShapeRange ",0x14);
  ::operator<<(local_198,this);
  std::__ostream_insert<char,std::char_traits<char>>(local_198," by negative or zero value ",0x1b);
  std::ostream::operator<<((ostream *)local_198,val);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_00,asStack_1c8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

ShapeRange ShapeRange::operator/ (int val) const {
    if (val <= 0) {
        std::stringstream ss;
        ss << "Dividing ShapeRange " << *this << " by negative or zero value " << val;
        throw std::runtime_error(ss.str());
    }
    else {
        return (*this)/(static_cast<size_t>(val));
    }
}